

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaPropertyBuilderPrivate::QMetaPropertyBuilderPrivate
          (QMetaPropertyBuilderPrivate *this,QByteArray *_name,QByteArray *_type,QMetaType _metaType
          ,int notifierIdx,int _revision)

{
  long lVar1;
  char *type;
  undefined8 in_RCX;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffff98;
  QByteArray *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  type = (char *)(in_RDI + 0x18);
  QByteArray::constData((QByteArray *)0x37a738);
  QMetaObject::normalizedType(type);
  *(undefined8 *)(in_RDI + 0x30) = in_RCX;
  *(undefined4 *)(in_RDI + 0x38) = 0x4003;
  *(undefined4 *)(in_RDI + 0x3c) = in_R8D;
  *(undefined4 *)(in_RDI + 0x40) = in_R9D;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMetaPropertyBuilderPrivate
            (const QByteArray& _name, const QByteArray& _type, QMetaType _metaType, int notifierIdx=-1,
             int _revision = 0)
        : name(_name),
          type(QMetaObject::normalizedType(_type.constData())),
          metaType(_metaType),
          flags(Readable | Writable | Scriptable), notifySignal(notifierIdx),
          revision(_revision)
    {

    }